

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_scanline_aa.h
# Opt level: O3

void __thiscall
agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::clip_box
          (rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_> *this,double x1,
          double y1,double x2,double y2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  (this->m_outline).m_curr_block = 0;
  (this->m_outline).m_num_cells = 0;
  (this->m_outline).m_curr_cell.x = 0x7fffffff;
  (this->m_outline).m_curr_cell.y = 0x7fffffff;
  (this->m_outline).m_curr_cell.cover = 0;
  (this->m_outline).m_curr_cell.area = 0;
  (this->m_outline).m_style_cell.x = 0x7fffffff;
  (this->m_outline).m_style_cell.y = 0x7fffffff;
  (this->m_outline).m_style_cell.cover = 0;
  (this->m_outline).m_style_cell.area = 0;
  (this->m_outline).m_sorted = false;
  (this->m_outline).m_min_x = 0x7fffffff;
  (this->m_outline).m_min_y = 0x7fffffff;
  (this->m_outline).m_max_x = -0x80000000;
  (this->m_outline).m_max_y = -0x80000000;
  lVar5 = -(ulong)(y2 * 256.0 < 0.0);
  auVar10._8_4_ = (int)lVar5;
  auVar10._0_8_ = -(ulong)(x2 * 256.0 < 0.0);
  auVar10._12_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar11 = blendvpd(_DAT_00114930,_DAT_00114980,auVar10);
  lVar5 = -(ulong)(y1 * 256.0 < 0.0);
  auVar1._8_4_ = (int)lVar5;
  auVar1._0_8_ = -(ulong)(x1 * 256.0 < 0.0);
  auVar1._12_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar10 = blendvpd(_DAT_00114930,_DAT_00114980,auVar1);
  this->m_status = 0;
  iVar8 = (int)(auVar11._0_8_ + x2 * 256.0);
  iVar9 = (int)(auVar11._8_8_ + y2 * 256.0);
  iVar6 = (int)(auVar10._0_8_ + x1 * 256.0);
  iVar7 = (int)(auVar10._8_8_ + y1 * 256.0);
  (this->m_clipper).m_clip_box.x1 = iVar6;
  (this->m_clipper).m_clip_box.y1 = iVar7;
  (this->m_clipper).m_clip_box.x2 = iVar8;
  (this->m_clipper).m_clip_box.y2 = iVar9;
  if (iVar8 < iVar6) {
    (this->m_clipper).m_clip_box.x1 = iVar8;
    (this->m_clipper).m_clip_box.x2 = iVar6;
  }
  auVar11._4_4_ = iVar7;
  auVar11._0_4_ = iVar6;
  auVar11._8_4_ = iVar8;
  auVar11._12_4_ = iVar9;
  uVar3 = extractps(auVar11,1);
  auVar2._4_4_ = iVar7;
  auVar2._0_4_ = iVar6;
  auVar2._8_4_ = iVar8;
  auVar2._12_4_ = iVar9;
  uVar4 = extractps(auVar2,3);
  if ((int)uVar4 < (int)uVar3) {
    (this->m_clipper).m_clip_box.y1 = (int)uVar4;
    (this->m_clipper).m_clip_box.y2 = (int)uVar3;
  }
  (this->m_clipper).m_clipping = true;
  return;
}

Assistant:

void rasterizer_scanline_aa<Clip>::clip_box(double x1, double y1, 
                                                double x2, double y2)
    {
        reset();
        m_clipper.clip_box(conv_type::upscale(x1), conv_type::upscale(y1), 
                           conv_type::upscale(x2), conv_type::upscale(y2));
    }